

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marshal.c
# Opt level: O2

void BinarySink_put_padding(BinarySink *bs,size_t len,uchar padbyte)

{
  undefined1 uVar1;
  undefined7 in_register_00000011;
  size_t sVar2;
  undefined1 uVar4;
  undefined1 auVar3 [16];
  char buf [16];
  
  uVar1 = (undefined1)((uint7)in_register_00000011 >> 8);
  uVar4 = (undefined1)((uint7)in_register_00000011 >> 0x10);
  auVar3[7] = uVar4;
  auVar3[6] = uVar4;
  auVar3[5] = uVar1;
  auVar3[4] = uVar1;
  auVar3[3] = (char)in_register_00000011;
  auVar3[2] = (char)in_register_00000011;
  auVar3[1] = padbyte;
  auVar3[0] = padbyte;
  auVar3._8_8_ = 0;
  auVar3 = pshuflw(auVar3,auVar3,0);
  buf._0_4_ = auVar3._0_4_;
  buf._4_4_ = buf._0_4_;
  buf._8_4_ = buf._0_4_;
  buf._12_4_ = buf._0_4_;
  for (; len != 0; len = len - sVar2) {
    sVar2 = 0x10;
    if (len < 0x10) {
      sVar2 = len;
    }
    (*bs->write)(bs,buf,sVar2);
  }
  return;
}

Assistant:

void BinarySink_put_padding(BinarySink *bs, size_t len, unsigned char padbyte)
{
    char buf[16];
    memset(buf, padbyte, sizeof(buf));
    while (len > 0) {
        size_t thislen = len < sizeof(buf) ? len : sizeof(buf);
        bs->write(bs, buf, thislen);
        len -= thislen;
    }
}